

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store_array_binary(XMLWriter *this,char *name,avector<Vec3fa> *vec)

{
  ostream *poVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  std::istream::tellg();
  tab(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x10,"<");
  poVar1 = std::operator<<(poVar1,name);
  poVar1 = std::operator<<(poVar1," ofs=\"");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,"\" size=\"");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\"/>");
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar2 = 0;
  for (uVar3 = 0; uVar3 < vec->size_active; uVar3 = uVar3 + 1) {
    std::ostream::write(&this->field_0x220,(long)&vec->items->field_0 + lVar2);
    lVar2 = lVar2 + 0x10;
  }
  return;
}

Assistant:

void XMLWriter::store_array_binary(const char* name, const avector<Vec3fa>& vec)
  {
    std::streampos offset = bin.tellg();
    tab(); xml << "<" << name << " ofs=\"" << offset << "\" size=\"" << vec.size() << "\"/>" << std::endl;
    for (size_t i=0; i<vec.size(); i++) bin.write((char*)&vec[i],sizeof(Vec3f));
  }